

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O2

void __thiscall wasm::CodeFolding::visitIf(CodeFolding *this,If *curr)

{
  Id IVar1;
  Block *block;
  Block *pBVar2;
  Block *pBVar3;
  initializer_list<wasm::CodeFolding::Tail> __l;
  Tail local_80;
  undefined8 uStack_68;
  Block *local_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> tails;
  anon_class_8_1_8991fb9c maybeAddBlock;
  
  block = (Block *)curr->ifFalse;
  if ((block != (Block *)0x0) && ((curr->condition->type).id != 1)) {
    pBVar2 = (Block *)curr->ifTrue;
    local_80.block = (Block *)0x0;
    if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id == BlockId)
    {
      local_80.block = pBVar2;
    }
    IVar1 = (block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id;
    pBVar3 = block;
    tails.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
    if ((IVar1 == BlockId) || (pBVar3 = (Block *)0x0, local_80.block == (Block *)0x0)) {
      if ((IVar1 == BlockId) && (local_80.block == (Block *)0x0)) {
        local_80.block =
             visitIf::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)
                        &tails.
                         super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,block,&curr->ifTrue);
      }
    }
    else {
      pBVar3 = visitIf::anon_class_8_1_8991fb9c::operator()
                         ((anon_class_8_1_8991fb9c *)
                          &tails.
                           super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,local_80.block,
                          &curr->ifFalse);
      local_80.block = pBVar2;
    }
    if ((((pBVar3 != (Block *)0x0) && (local_80.block != (Block *)0x0)) &&
        (((local_80.block)->name).super_IString.str._M_str == (char *)0x0)) &&
       ((pBVar3->name).super_IString.str._M_str == (char *)0x0)) {
      local_80.expr = (Expression *)0x0;
      local_80.pointer = (Expression **)0x0;
      uStack_68 = 0;
      local_58 = 0;
      __l._M_len = 2;
      __l._M_array = &local_80;
      local_60 = pBVar3;
      std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::vector
                ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)
                 local_50,__l,(allocator_type *)((long)&maybeAddBlock.this + 7));
      optimizeExpressionTails<wasm::If>
                (this,(vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)
                      local_50,curr);
      std::_Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
      ~_Vector_base((_Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                     *)local_50);
    }
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    if (!curr->ifFalse) {
      return;
    }
    if (curr->condition->type == Type::unreachable) {
      // If the arms are foldable and concrete, we would be replacing an
      // unreachable If with a concrete block, which may or may not be valid,
      // depending on the context. Leave this for DCE rather than trying to
      // handle that.
      return;
    }
    // If both are blocks, look for a tail we can merge.
    auto* left = curr->ifTrue->dynCast<Block>();
    auto* right = curr->ifFalse->dynCast<Block>();
    // If one is a block and the other isn't, and the non-block is a tail of the
    // other, we can fold that - for our convenience, we just add a block and
    // run the rest of the optimization mormally.
    auto maybeAddBlock = [this](Block* block, Expression*& other) -> Block* {
      // If other is a suffix of the block, wrap it in a block.
      if (block->list.empty() ||
          !ExpressionAnalyzer::equal(other, block->list.back())) {
        return nullptr;
      }
      // Do it, assign to the out param `other`, and return the block.
      Builder builder(*getModule());
      auto* ret = builder.makeBlock(other);
      other = ret;
      return ret;
    };
    if (left && !right) {
      right = maybeAddBlock(left, curr->ifFalse);
    } else if (!left && right) {
      left = maybeAddBlock(right, curr->ifTrue);
    }
    // We need nameless blocks, as if there is a name, someone might branch to
    // the end, skipping the code we want to merge.
    if (left && right && !left->name.is() && !right->name.is()) {
      std::vector<Tail> tails = {Tail(left), Tail(right)};
      optimizeExpressionTails(tails, curr);
    }
  }